

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::append(QTextEdit *this,QString *text)

{
  QTextEditPrivate *this_00;
  QScrollBar *this_01;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  QWidgetTextControl local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  bVar1 = isReadOnly(this);
  if (bVar1) {
    iVar3 = QTextEditPrivate::verticalOffset(this_00);
    iVar4 = QAbstractSlider::maximum
                      (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
    cVar2 = iVar4 <= iVar3;
  }
  else {
    QWidgetTextControl::textCursor(local_30);
    cVar2 = QTextCursor::atEnd();
    QTextCursor::~QTextCursor((QTextCursor *)local_30);
  }
  QWidgetTextControl::append((QWidgetTextControl *)this_00->control,text);
  if (cVar2 != '\0') {
    this_01 = (this_00->super_QAbstractScrollAreaPrivate).vbar;
    iVar3 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
    QAbstractSlider::setValue(&this_01->super_QAbstractSlider,iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::append(const QString &text)
{
    Q_D(QTextEdit);
    const bool atBottom = isReadOnly() ?  d->verticalOffset() >= d->vbar->maximum() :
            d->control->textCursor().atEnd();
    d->control->append(text);
    if (atBottom)
        d->vbar->setValue(d->vbar->maximum());
}